

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O2

int IDASetJacTimes(void *ida_mem,IDALsJacTimesSetupFn jtsetup,IDALsJacTimesVecFn jtimes)

{
  int iVar1;
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"IDASetJacTimes",&IDA_mem,&idals_mem);
  if (iVar1 == 0) {
    if (idals_mem->LS->ops->setatimes ==
        (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) {
      iVar1 = -3;
      IDAProcessError(IDA_mem,-3,0x1e5,"IDASetJacTimes",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_ls.c"
                      ,"SUNLinearSolver object does not support user-supplied ATimes routine");
    }
    else {
      if (jtimes == (IDALsJacTimesVecFn)0x0) {
        idals_mem->jtimesDQ = 1;
        idals_mem->jtsetup = (IDALsJacTimesSetupFn)0x0;
        idals_mem->jtimes = idaLsDQJtimes;
        idals_mem->jt_res = IDA_mem->ida_res;
      }
      else {
        idals_mem->jtimesDQ = 0;
        idals_mem->jtsetup = jtsetup;
        idals_mem->jtimes = jtimes;
        IDA_mem = (IDAMem)IDA_mem->ida_user_data;
      }
      idals_mem->jt_data = IDA_mem;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int IDASetJacTimes(void* ida_mem, IDALsJacTimesSetupFn jtsetup,
                   IDALsJacTimesVecFn jtimes)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* issue error if LS object does not allow user-supplied ATimes */
  if (idals_mem->LS->ops->setatimes == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "SUNLinearSolver object does not support user-supplied ATimes routine");
    return (IDALS_ILL_INPUT);
  }

  /* store function pointers for user-supplied routines in IDALs
     interface (NULL jtimes implies use of DQ default) */
  if (jtimes != NULL)
  {
    idals_mem->jtimesDQ = SUNFALSE;
    idals_mem->jtsetup  = jtsetup;
    idals_mem->jtimes   = jtimes;
    idals_mem->jt_data  = IDA_mem->ida_user_data;
  }
  else
  {
    idals_mem->jtimesDQ = SUNTRUE;
    idals_mem->jtsetup  = NULL;
    idals_mem->jtimes   = idaLsDQJtimes;
    idals_mem->jt_res   = IDA_mem->ida_res;
    idals_mem->jt_data  = IDA_mem;
  }

  return (IDALS_SUCCESS);
}